

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pragma_user_agent.cpp
# Opt level: O3

void duckdb::PragmaUserAgentFunction
               (ClientContext *context,TableFunctionInput *data_p,DataChunk *output)

{
  GlobalTableFunctionState *pGVar1;
  string local_80;
  Value local_60;
  
  optional_ptr<duckdb::GlobalTableFunctionState,_true>::CheckValid(&data_p->global_state);
  pGVar1 = (data_p->global_state).ptr;
  if (*(char *)&pGVar1[5]._vptr_GlobalTableFunctionState == '\0') {
    output->count = 1;
    local_80._M_dataplus._M_p = (pointer)&local_80.field_2;
    ::std::__cxx11::string::_M_construct<char*>
              ((string *)&local_80,pGVar1[1]._vptr_GlobalTableFunctionState,
               (long)pGVar1[2]._vptr_GlobalTableFunctionState +
               (long)pGVar1[1]._vptr_GlobalTableFunctionState);
    Value::Value(&local_60,&local_80);
    DataChunk::SetValue(output,0,0,&local_60);
    Value::~Value(&local_60);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_80._M_dataplus._M_p != &local_80.field_2) {
      operator_delete(local_80._M_dataplus._M_p);
    }
    *(undefined1 *)&pGVar1[5]._vptr_GlobalTableFunctionState = 1;
  }
  return;
}

Assistant:

void PragmaUserAgentFunction(ClientContext &context, TableFunctionInput &data_p, DataChunk &output) {
	auto &data = data_p.global_state->Cast<PragmaUserAgentData>();

	if (data.finished) {
		// signal end of output
		return;
	}

	output.SetCardinality(1);
	output.SetValue(0, 0, data.user_agent);

	data.finished = true;
}